

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O1

sysbvm_tuple_t sysbvm_float32_parseString(sysbvm_context_t *context,size_t stringSize,char *string)

{
  double dVar1;
  char *__nptr;
  
  __nptr = (char *)malloc(stringSize + 1);
  memcpy(__nptr,string,stringSize);
  __nptr[stringSize] = '\0';
  dVar1 = atof(__nptr);
  free(__nptr);
  return (ulong)(uint)(float)dVar1 << 4 | 0xd;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_float32_parseString(sysbvm_context_t *context, size_t stringSize, const char *string)
{
    char *buffer = (char*)malloc(stringSize + 1);
    memcpy(buffer, string, stringSize);
    buffer[stringSize] = 0;

    sysbvm_tuple_t result = sysbvm_float32_parseCString(context, buffer);
    free(buffer);
    return result;
}